

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::SPxFastRT<double>::maxShortLeave
          (SPxFastRT<double> *this,double *sel,int leave,double maxabs)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  double dVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &(this->super_SPxRatioTester<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar8 = -(ulong)((local_30._M_ptr)->s_epsilon_multiplier == 1.0);
  dVar4 = (double)(~uVar8 & (ulong)((local_30._M_ptr)->s_epsilon_multiplier * 1e-05) |
                  uVar8 & 0x3ee4f8b588e368f1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  pSVar2 = (this->super_SPxRatioTester<double>).thesolver;
  pUVar3 = pSVar2->theFvec;
  lVar6 = (long)leave;
  dVar1 = (pUVar3->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6];
  *sel = dVar1;
  lVar7 = 0x670;
  if ((dVar4 * maxabs < dVar1) || (lVar7 = 0x688, dVar1 < -maxabs * dVar4)) {
    *sel = (*(double *)
             (*(long *)((long)&(pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                               super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                               _vptr_ClassArray + lVar7) + lVar6 * 8) -
           (pUVar3->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6]) / dVar1;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool SPxFastRT<R>::maxShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}